

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O0

void __thiscall trieste::wf::Sequence::gen(Sequence *this,Gen *g,size_t depth,Node *node)

{
  Node *pNVar1;
  size_t sVar2;
  Result RVar3;
  shared_ptr<trieste::NodeDef> local_60 [2];
  shared_ptr<trieste::NodeDef> local_40;
  ulong local_30;
  size_t i;
  Node *node_local;
  size_t depth_local;
  Gen *g_local;
  Sequence *this_local;
  
  i = (size_t)node;
  node_local = (Node *)depth;
  depth_local = (size_t)g;
  g_local = (Gen *)this;
  for (local_30 = 0; sVar2 = depth_local, pNVar1 = node_local, local_30 < this->minlen;
      local_30 = local_30 + 1) {
    std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_40,node);
    Choice::gen(&this->choice,(Gen *)sVar2,(size_t)pNVar1,&local_40);
    std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_40);
  }
  while (RVar3 = Gen::next((Gen *)depth_local), sVar2 = depth_local, pNVar1 = node_local,
        (RVar3 & 1) != 0) {
    std::shared_ptr<trieste::NodeDef>::shared_ptr(local_60,node);
    Choice::gen(&this->choice,(Gen *)sVar2,(size_t)pNVar1,local_60);
    std::shared_ptr<trieste::NodeDef>::~shared_ptr(local_60);
  }
  return;
}

Assistant:

void gen(Gen& g, size_t depth, Node node) const
      {
        for (size_t i = 0; i < minlen; ++i)
          choice.gen(g, depth, node);

        while (g.next() % 2)
          choice.gen(g, depth, node);
      }